

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void __thiscall ON_Mesh::EmergencyDestroy(ON_Mesh *this)

{
  ON_Mesh *this_local;
  
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x17])(this,0);
  ON_SimpleArray<ON_3dPoint>::EmergencyDestroy(&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
  ON_SimpleArray<ON_3fPoint>::EmergencyDestroy(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  ON_SimpleArray<ON_MeshFace>::EmergencyDestroy(&this->m_F);
  ON_SimpleArray<ON_3fVector>::EmergencyDestroy(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
  ON_SimpleArray<ON_3fVector>::EmergencyDestroy(&(this->m_FN).super_ON_SimpleArray<ON_3fVector>);
  ON_SimpleArray<ON_2fPoint>::EmergencyDestroy(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
  ON_ClassArray<ON_TextureCoordinates>::EmergencyDestroy(&this->m_TC);
  ON_SimpleArray<ON_2dPoint>::EmergencyDestroy(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
  ON_SimpleArray<ON_SurfaceCurvature>::EmergencyDestroy(&this->m_K);
  ON_SimpleArray<ON_Color>::EmergencyDestroy(&this->m_C);
  ON_SimpleArray<unsigned_int>::EmergencyDestroy(&this->m_NgonMap);
  ON_SimpleArray<ON_MeshNgon_*>::EmergencyDestroy(&this->m_Ngon);
  return;
}

Assistant:

void ON_Mesh::EmergencyDestroy()
{
  DestroyRuntimeCache( false );
  m_dV.EmergencyDestroy();
  m_V.EmergencyDestroy();
  m_F.EmergencyDestroy();
  m_N.EmergencyDestroy();
  m_FN.EmergencyDestroy();
  m_T.EmergencyDestroy();
  m_TC.EmergencyDestroy();
  m_S.EmergencyDestroy();
  m_K.EmergencyDestroy();
  m_C.EmergencyDestroy();
  m_NgonMap.EmergencyDestroy();
  m_Ngon.EmergencyDestroy();
}